

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
ColumnSampler<double>::leave_m_cols
          (ColumnSampler<double> *this,size_t m,Xoshiro256PP *rnd_generator)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  size_type __n;
  pointer in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  result_type_conflict1 rVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t ix;
  size_t lev_1;
  size_t lev;
  size_t col;
  size_t curr_ix;
  double curr_subrange;
  double w_left;
  double rnd_subrange;
  vector<double,_std::allocator<double>_> curr_weights;
  size_t chosen;
  Xoshiro256PP *in_stack_fffffffffffffec8;
  ColumnSampler<double> *in_stack_fffffffffffffed0;
  value_type vVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffee0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  pointer puVar9;
  pointer local_c8;
  pointer local_b8;
  size_type local_b0;
  Xoshiro256PP *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> local_68;
  unsigned_long *local_50;
  unsigned_long *local_48;
  result_type local_20;
  pointer local_10;
  
  if ((in_RSI != (pointer)0x0) &&
     (in_RSI < in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)) {
    local_10 = in_RSI;
    bVar1 = has_weights((ColumnSampler<double> *)0x1fe049);
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec8);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (double *)in_stack_fffffffffffffed0);
      for (local_b8 = (pointer)0x0; local_b8 < local_10; local_b8 = (pointer)((long)local_b8 + 1)) {
        local_b0 = 0;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,0);
        if (*pvVar4 <= 0.0) {
          if (local_b8 == (pointer)0x0) {
            drop_weights(in_stack_fffffffffffffed0);
            goto LAB_001fe670;
          }
          local_10 = local_b8;
          break;
        }
        for (local_c8 = (pointer)0x0;
            local_c8 <
            in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; local_c8 = (pointer)((long)local_c8 + 1)) {
          std::uniform_real_distribution<double>::uniform_real_distribution
                    ((uniform_real_distribution<double> *)in_stack_fffffffffffffed0,
                     (double)in_stack_fffffffffffffec8,1.0325799075106e-317);
          rVar5 = std::uniform_real_distribution<double>::operator()
                            ((uniform_real_distribution<double> *)in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffec8);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_68,local_b0 * 2 + 1);
          local_b0 = local_b0 * 2 + 1 + (ulong)(*pvVar4 <= rVar5);
          std::vector<double,_std::allocator<double>_>::operator[](&local_68,local_b0);
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,local_b0);
        vVar8 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),local_b0);
        *pvVar4 = vVar8;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,local_b0);
        *pvVar4 = 0.0;
        for (puVar9 = (pointer)0x0;
            puVar9 < in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish; puVar9 = (pointer)((long)puVar9 + 1)
            ) {
          local_b0 = local_b0 - 1 >> 1;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_68,local_b0 * 2 + 1);
          vVar8 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_68,local_b0 * 2 + 2);
          in_stack_fffffffffffffee0._M_current = (double *)(vVar8 + *pvVar4);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,local_b0);
          *pvVar4 = (value_type)in_stack_fffffffffffffee0._M_current;
        }
      }
      __n = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
      while (__n = __n - 1, __n != 0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),__n);
        vVar8 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),__n - 1 >> 1);
        *pvVar4 = vVar8 + *pvVar4;
      }
      in_RDI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)in_RDI[3].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)local_10);
LAB_001fe670:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0._M_current);
    }
    else if ((pointer)((ulong)in_RDI[3].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) < local_10) {
      auVar6._8_4_ = (int)((ulong)local_10 >> 0x20);
      auVar6._0_8_ = local_10;
      auVar6._12_4_ = 0x45300000;
      puVar9 = in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar7._8_4_ = (int)((ulong)puVar9 >> 0x20);
      auVar7._0_8_ = puVar9;
      auVar7._12_4_ = 0x45300000;
      if ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_10) - 4503599627370496.0) <
          ((auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)puVar9) - 4503599627370496.0)) * 0.75) {
        local_48 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffec8);
        local_50 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffec8);
        std::
        shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Xoshiro::Xoshiro256PP&>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = local_10;
      }
      else {
        in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)in_RDI[3].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + -1);
        while ((pointer)((long)in_RDI[3].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)local_10) <
               in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start) {
          std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                    ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffed0,
                     (unsigned_long)in_stack_fffffffffffffec8,0x1fe1c6);
          local_20 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffed0
                                ,in_stack_fffffffffffffec8);
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RDI,local_20);
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RDI,(size_type)
                                     in_RDI[2].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          std::swap<unsigned_long>(pvVar2,pvVar3);
          in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)in_RDI[2].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + -1);
        }
        in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = local_10;
      }
    }
    else {
      in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      while (in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start < local_10) {
        std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                  ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffed0,
                   (unsigned_long)in_stack_fffffffffffffec8,0x1fe0b5);
        local_20 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8);
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(long)in_RDI[2].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_20);
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,(size_type)
                                   in_RDI[2].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        std::swap<unsigned_long>(pvVar2,pvVar3);
        in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)in_RDI[2].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1);
      }
    }
  }
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::leave_m_cols(size_t m, RNG_engine &rnd_generator)
{
    if (m == 0 || m >= this->n_cols)
        return;

    if (!this->has_weights())
    {
        size_t chosen;
        if (m <= this->n_cols / 4)
        {
            for (this->curr_pos = 0; this->curr_pos < m; this->curr_pos++)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->n_cols - this->curr_pos - 1)(rnd_generator);
                std::swap(this->col_indices[this->curr_pos + chosen], this->col_indices[this->curr_pos]);
            }
        }

        else if ((ldouble_safe)m >= (ldouble_safe)(3./4.) * (ldouble_safe)this->n_cols)
        {
            for (this->curr_pos = this->n_cols-1; this->curr_pos > this->n_cols - m; this->curr_pos--)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->curr_pos)(rnd_generator);
                std::swap(this->col_indices[chosen], this->col_indices[this->curr_pos]);
            }
            this->curr_pos = m;
        }

        else
        {
            std::shuffle(this->col_indices.begin(), this->col_indices.end(), rnd_generator);
            this->curr_pos = m;
        }
    }

    else
    {
        std::vector<double> curr_weights = this->tree_weights;
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
        double rnd_subrange, w_left;
        double curr_subrange;
        size_t curr_ix;

        for (size_t col = 0; col < m; col++)
        {
            curr_ix = 0;
            curr_subrange = curr_weights[0];
            if (curr_subrange <= 0)
            {
                if (col == 0)
                {
                    this->drop_weights();
                    return;
                }

                else
                {
                    m = col;
                    goto rebuild_tree;
                }
            }

            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = curr_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = curr_weights[curr_ix];
            }

            this->tree_weights[curr_ix] = curr_weights[curr_ix];

            /* now remove the weight of the chosen element */
            curr_weights[curr_ix] = 0;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                curr_weights[curr_ix] =   curr_weights[ix_child(curr_ix)]
                                        + curr_weights[ix_child(curr_ix) + 1];
            }
        }

        /* rebuild the tree after getting new weights */
        rebuild_tree:
        for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
            this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

        this->n_dropped = this->n_cols - m;
    }
}